

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O1

void RigidBodyDynamics::ForwardDynamicsApplyConstraintForces
               (Model *model,VectorNd *Tau,ConstraintSet *CS,VectorNd *QDDot)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  uint uVar9;
  pointer pJVar10;
  double *pdVar11;
  CustomJoint *pCVar12;
  pointer pSVar13;
  pointer pSVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar27;
  double dVar28;
  double dVar29;
  undefined8 uVar30;
  Index rows;
  ulong uVar31;
  long lVar32;
  double *pdVar33;
  pointer pSVar34;
  uint uVar35;
  ulong uVar36;
  pointer pMVar37;
  ulong uVar38;
  double dVar39;
  Index dstRows_1;
  Index othersize;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  pointer pSVar43;
  SpatialTransform *pSVar44;
  Index othersize_1;
  double dVar45;
  byte bVar46;
  VectorNd tau_temp;
  SpatialMatrix Ia;
  SpatialVector pa;
  VectorNd qdd_temp;
  add_assign_op<double,_double> local_409;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_408;
  VectorNd *local_3f8;
  VectorNd *local_3f0;
  Product<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>
  local_3e8;
  ulong local_3d0;
  undefined1 local_3c8 [40];
  CustomJoint *pCStack_3a0;
  CustomJoint *local_398;
  CustomJoint *local_390;
  double local_388;
  double local_370;
  SpatialMatrix local_2a8;
  SpatialVector_t local_188;
  SpatialMatrix_t local_158;
  
  bVar46 = 0;
  uVar31 = ((long)(model->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(model->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
  local_3f8 = QDDot;
  local_3f0 = Tau;
  if (1 < uVar31) {
    uVar40 = 1;
    uVar35 = 2;
    do {
      Math::SpatialRigidBodyInertia::toMatrix
                ((model->I).
                 super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar40);
      memcpy((model->IA).super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
             super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>._M_impl
             .super__Vector_impl_data._M_start + uVar40,&local_2a8,0x120);
      pSVar34 = (model->v).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar42 = uVar40 * 0x30;
      Math::SpatialRigidBodyInertia::operator*
                ((model->I).
                 super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar40,pSVar34 + uVar40);
      dVar45 = *(double *)
                ((long)&pSVar34[uVar40].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
      dVar39 = *(double *)
                &pSVar34[uVar40].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
      dVar5 = *(double *)
               ((long)&pSVar34[uVar40].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
      dVar6 = *(double *)
               ((long)&pSVar34[uVar40].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28);
      dVar7 = *(double *)
               ((long)&pSVar34[uVar40].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
      dVar8 = *(double *)
               ((long)&pSVar34[uVar40].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
      pSVar34 = (model->pA).
                super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      *(double *)
       &pSVar34[uVar40].super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
           local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] *
           dVar7 + -dVar6 * local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array[4] +
                   -dVar45 * local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array[1] +
                   dVar5 * local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                           m_data.array[2];
      *(double *)
       ((long)&pSVar34[uVar40].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
           local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] *
           -dVar8 + dVar6 * local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array[3] +
                    dVar45 * local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array[0] +
                    -dVar39 * local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[2];
      pdVar33 = (double *)
                ((long)&pSVar34[uVar40].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
      *pdVar33 = local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [4] * dVar8 +
                 ((local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[1] * dVar39 -
                  dVar5 * local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[0]) -
                 dVar7 * local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                         m_data.array[3]);
      pdVar33[1] = local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[4] * -dVar45 +
                   dVar5 * local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                           m_data.array[5];
      pdVar33 = (double *)
                ((long)&pSVar34[uVar40].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
      *pdVar33 = local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [3] * dVar45 +
                 -dVar39 * local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                           m_data.array[5];
      pdVar33[1] = local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[3] * -dVar5 +
                   dVar39 * local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array[4];
      dVar45 = *(double *)(*(long *)(CS + 0x550) + lVar42);
      if ((dVar45 != 0.0) || (NAN(dVar45))) {
LAB_0013d95f:
        Math::SpatialTransform::toMatrixAdjoint
                  (&local_2a8,
                   (model->X_base).
                   super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar40);
        lVar32 = *(long *)(CS + 0x550);
        pSVar34 = (model->pA).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        dVar45 = *(double *)(lVar32 + lVar42);
        dVar39 = *(double *)(lVar32 + 8 + lVar42);
        dVar5 = *(double *)(lVar32 + 0x10 + lVar42);
        dVar6 = *(double *)(lVar32 + 0x18 + lVar42);
        dVar7 = *(double *)(lVar32 + 0x20 + lVar42);
        dVar8 = *(double *)(lVar32 + 0x28 + lVar42);
        dVar27 = *(double *)
                  ((long)&pSVar34[uVar40].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) -
                 (local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array[0x1f] * dVar8 +
                 local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [0x19] * dVar7 +
                 local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [0x13] * dVar6 +
                 local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [0xd] * dVar5 +
                 local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [7] * dVar39 +
                 local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [1] * dVar45);
        auVar15._8_4_ = SUB84(dVar27,0);
        auVar15._0_8_ =
             *(double *)
              &pSVar34[uVar40].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> -
             (local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
              [0x1e] * dVar8 +
             local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             [0x18] * dVar7 +
             local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             [0x12] * dVar6 +
             local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             [0xc] * dVar5 +
             local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6]
             * dVar39 +
             local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0]
             * dVar45);
        auVar15._12_4_ = (int)((ulong)dVar27 >> 0x20);
        *(undefined1 (*) [16])
         &pSVar34[uVar40].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = auVar15;
        pdVar33 = (double *)
                  ((long)&pSVar34[uVar40].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        dVar27 = pdVar33[1] -
                 (local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array[0x21] * dVar8 +
                 local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [0x1b] * dVar7 +
                 local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [0x15] * dVar6 +
                 local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [0xf] * dVar5 +
                 local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [9] * dVar39 +
                 local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [3] * dVar45);
        pdVar11 = (double *)
                  ((long)&pSVar34[uVar40].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar28 = *pdVar11;
        dVar29 = pdVar11[1];
        auVar16._8_4_ = SUB84(dVar27,0);
        auVar16._0_8_ =
             *pdVar33 -
             (local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
              [0x20] * dVar8 +
             local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             [0x1a] * dVar7 +
             local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             [0x14] * dVar6 +
             local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             [0xe] * dVar5 +
             local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[8]
             * dVar39 +
             local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2]
             * dVar45);
        auVar16._12_4_ = (int)((ulong)dVar27 >> 0x20);
        *(undefined1 (*) [16])
         ((long)&pSVar34[uVar40].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = auVar16;
        pdVar33 = (double *)
                  ((long)&pSVar34[uVar40].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        *pdVar33 = dVar28 - (dVar8 * local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                     m_storage.m_data.array[0x22] +
                            dVar7 * local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                    m_storage.m_data.array[0x1c] +
                            dVar6 * local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                    m_storage.m_data.array[0x16] +
                            dVar5 * local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                    m_storage.m_data.array[0x10] +
                            dVar39 * local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                     m_storage.m_data.array[10] +
                            dVar45 * local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                     m_storage.m_data.array[4]);
        pdVar33[1] = dVar29 - (dVar8 * local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                       m_storage.m_data.array[0x23] +
                              dVar7 * local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                      m_storage.m_data.array[0x1d] +
                              dVar6 * local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                      m_storage.m_data.array[0x17] +
                              dVar5 * local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                      m_storage.m_data.array[0x11] +
                              dVar39 * local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                       m_storage.m_data.array[0xb] +
                              dVar45 * local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                       m_storage.m_data.array[5]);
      }
      else {
        lVar32 = *(long *)(CS + 0x550) + lVar42;
        if ((((*(double *)(lVar32 + 8) != 0.0) ||
             ((((NAN(*(double *)(lVar32 + 8)) || (*(double *)(lVar32 + 0x10) != 0.0)) ||
               (NAN(*(double *)(lVar32 + 0x10)))) ||
              ((*(double *)(lVar32 + 0x18) != 0.0 || (NAN(*(double *)(lVar32 + 0x18)))))))) ||
            (*(double *)(lVar32 + 0x20) != 0.0)) ||
           (((NAN(*(double *)(lVar32 + 0x20)) || (*(double *)(lVar32 + 0x28) != 0.0)) ||
            (NAN(*(double *)(lVar32 + 0x28)))))) goto LAB_0013d95f;
      }
      uVar40 = (ulong)uVar35;
      uVar31 = ((long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
      uVar35 = uVar35 + 1;
    } while (uVar40 <= uVar31 && uVar31 - uVar40 != 0);
  }
  uVar35 = (int)uVar31 - 1;
  if (uVar35 != 0) {
    uVar31 = (ulong)uVar35;
    do {
      pJVar10 = (model->mJoints).
                super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                .
                super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar35 = pJVar10[uVar31].q_index;
      if (pJVar10[uVar31].mDoFCount == 1) {
        if (pJVar10[uVar31].mJointType == JointTypeCustom) goto LAB_0013db93;
        pSVar34 = (model->S).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pSVar14 = (model->pA).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pdVar33 = (double *)
                  ((long)&pSVar34[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        pdVar11 = (double *)
                  ((long)&pSVar14[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        pdVar3 = (double *)
                 ((long)&pSVar34[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        pdVar4 = (double *)
                 ((long)&pSVar14[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        (model->u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
        [uVar31] = (local_3f0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data[uVar35] -
                   (pdVar3[1] * pdVar4[1] + pdVar33[1] * pdVar11[1] +
                    *(double *)
                     ((long)&pSVar34[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) *
                    *(double *)
                     ((long)&pSVar14[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) +
                   *pdVar3 * *pdVar4 + *pdVar33 * *pdVar11 +
                   *(double *)
                    &pSVar34[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *
                   *(double *)
                    &pSVar14[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>);
        uVar40 = (ulong)(model->lambda).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar31];
        if (uVar40 != 0) {
          local_3c8._0_8_ =
               (model->IA).super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
               .super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar31;
          local_3c8._8_8_ =
               (model->U).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar31;
          local_3c8._32_8_ =
               (model->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data[uVar31];
          local_3c8._16_8_ = local_3c8._8_8_;
          SpatialMatrix_t::
          SpatialMatrix_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,6,0,6,6>const,Eigen::Product<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const>,0>const>>
                    (&local_2a8,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_const_Eigen::Product<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>,_0>_>_>
                      *)local_3c8);
          local_3c8._8_8_ =
               (model->pA).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
               .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar31;
          local_3c8._24_8_ =
               (model->c).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar31;
          local_398 = (CustomJoint *)
                      ((model->U).
                       super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                       super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar31);
          local_388 = (model->u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_data[uVar31];
          local_370 = (model->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_data[uVar31];
          local_3c8._16_8_ = &local_2a8;
          SpatialVector_t::
          SpatialVector_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const>>
                    (&local_188,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>_>
                      *)local_3c8);
          Math::SpatialTransform::toMatrixTranspose
                    ((SpatialMatrix *)local_3c8,
                     (model->X_lambda).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar31);
          Math::SpatialTransform::toMatrix
                    ((SpatialMatrix *)&local_158,
                     (model->X_lambda).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar31);
          local_3e8.m_lhs.m_lhs = (LhsNested)local_3c8;
          local_3e8.m_lhs.m_rhs = &local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>;
          local_3e8.m_rhs = (RhsNested)&local_158;
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,6,0,6,6>,0>,Eigen::Matrix<double,6,6,0,6,6>,1>,Eigen::internal::add_assign_op<double,double>>
                    (&(model->IA).
                      super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                      super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar40].
                      super_Matrix<double,_6,_6,_0,_6,_6>,&local_3e8,
                     (add_assign_op<double,_double> *)&local_408);
          Math::SpatialTransform::applyTranspose
                    ((model->X_lambda).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar31,&local_188);
          pSVar34 = (model->pA).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          goto LAB_0013e391;
        }
      }
      else if ((pJVar10[uVar31].mDoFCount == 3) && (pJVar10[uVar31].mJointType != JointTypeCustom))
      {
        uVar40 = (ulong)(model->lambda).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar31];
        pdVar33 = (local_3f0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_data;
        local_3c8._0_8_ = pdVar33[uVar35];
        local_3c8._8_8_ = pdVar33[uVar35 + 1];
        local_3c8._16_8_ = pdVar33[uVar35 + 2];
        local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
             (double)((model->multdof3_S).
                      super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      .
                      super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar31);
        local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
             (double)((model->pA).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar31);
        local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
             (double)local_3c8;
        Vector3_t::operator=
                  ((model->multdof3_u).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar31,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>_>
                    *)&local_2a8);
        if (uVar40 != 0) {
          local_3c8._0_8_ =
               (model->IA).super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
               .super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar31;
          local_3c8._8_8_ =
               (model->multdof3_U).
               super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
               .
               super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar31;
          local_3c8._16_8_ =
               (model->multdof3_Dinv).super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar31;
          local_3c8._24_8_ = local_3c8._8_8_;
          SpatialMatrix_t::
          SpatialMatrix_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,6,0,6,6>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,0>const>>
                    (&local_2a8,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_0>_>_>
                      *)local_3c8);
          local_3c8._8_8_ =
               (model->pA).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
               .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar31;
          local_3c8._24_8_ =
               (model->c).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar31;
          pCStack_3a0 = (CustomJoint *)
                        ((model->multdof3_U).
                         super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                         .
                         super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar31);
          local_398 = (CustomJoint *)
                      ((model->multdof3_Dinv).
                       super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar31);
          local_390 = (CustomJoint *)
                      ((model->multdof3_u).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar31);
          local_3c8._16_8_ = &local_2a8;
          Eigen::internal::
          assignment_from_xpr_op_product<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>const>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>,Eigen::internal::assign_op<double,double>,Eigen::internal::add_assign_op<double,double>>
          ::
          run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>const>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const>,Eigen::internal::assign_op<double,double>>
                    (&local_188.super_Matrix<double,_6,_1,_0,_6,_1>,
                     (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                      *)local_3c8,(assign_op<double,_double> *)&local_158);
          Math::SpatialTransform::toMatrixTranspose
                    ((SpatialMatrix *)local_3c8,
                     (model->X_lambda).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar31);
          Math::SpatialTransform::toMatrix
                    ((SpatialMatrix *)&local_158,
                     (model->X_lambda).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar31);
          local_3e8.m_lhs.m_rhs = &local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>;
          local_3e8.m_lhs.m_lhs = (LhsNested)local_3c8;
          local_3e8.m_rhs = (RhsNested)&local_158;
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,6,0,6,6>,0>,Eigen::Matrix<double,6,6,0,6,6>,1>,Eigen::internal::add_assign_op<double,double>>
                    (&(model->IA).
                      super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                      super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar40].
                      super_Matrix<double,_6,_6,_0,_6,_6>,&local_3e8,
                     (add_assign_op<double,_double> *)&local_408);
          Math::SpatialTransform::applyTranspose
                    ((model->X_lambda).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar31,&local_188);
          pSVar34 = (model->pA).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
LAB_0013e391:
          dVar45 = (double)local_3c8._8_8_ +
                   *(double *)
                    ((long)&pSVar34[uVar40].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
          auVar24._8_4_ = SUB84(dVar45,0);
          auVar24._0_8_ =
               (double)local_3c8._0_8_ +
               *(double *)
                &pSVar34[uVar40].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
          auVar24._12_4_ = (int)((ulong)dVar45 >> 0x20);
          *(undefined1 (*) [16])
           &pSVar34[uVar40].super_Matrix<double,_6,_1,_0,_6,_1>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = auVar24;
          pdVar33 = (double *)
                    ((long)&pSVar34[uVar40].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          dVar45 = (double)local_3c8._24_8_ + pdVar33[1];
          auVar25._8_4_ = SUB84(dVar45,0);
          auVar25._0_8_ = (double)local_3c8._16_8_ + *pdVar33;
          auVar25._12_4_ = (int)((ulong)dVar45 >> 0x20);
          *(undefined1 (*) [16])
           ((long)&pSVar34[uVar40].super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = auVar25;
          pdVar33 = (double *)
                    ((long)&pSVar34[uVar40].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          dVar45 = (double)pCStack_3a0 + pdVar33[1];
          auVar26._8_4_ = SUB84(dVar45,0);
          auVar26._0_8_ = (double)local_3c8._32_8_ + *pdVar33;
          auVar26._12_4_ = (int)((ulong)dVar45 >> 0x20);
          *(undefined1 (*) [16])
           ((long)&pSVar34[uVar40].super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = auVar26;
        }
      }
      else {
LAB_0013db93:
        if (pJVar10[uVar31].mJointType == JointTypeCustom) {
          uVar38 = (ulong)pJVar10[uVar31].custom_joint_index;
          uVar41 = (ulong)*(uint *)((model->mCustomJoints).
                                    super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar38] + 8);
          uVar40 = (ulong)(model->lambda).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar31];
          local_408.m_storage.m_data = (double *)0x0;
          local_408.m_storage.m_rows = 0;
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&local_408,uVar41,1);
          if (local_408.m_storage.m_rows != uVar41) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&local_408,uVar41,1);
          }
          rows = local_408.m_storage.m_rows;
          if (0 < local_408.m_storage.m_rows) {
            memset(local_408.m_storage.m_data,0,local_408.m_storage.m_rows * 8);
          }
          pdVar33 = local_408.m_storage.m_data;
          if (uVar41 != 0) {
            pdVar11 = (local_3f0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data;
            uVar36 = 0;
            do {
              local_408.m_storage.m_data[uVar36] = pdVar11[(int)uVar36 + uVar35];
              uVar36 = uVar36 + 1;
            } while (uVar41 != uVar36);
          }
          pCVar12 = (model->mCustomJoints).
                    super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar38];
          pSVar34 = (model->pA).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar31;
          local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
               0.0;
          local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
               0.0;
          local_3d0 = uVar38;
          if (rows != 0) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_2a8,rows,1
                      );
          }
          dVar45 = local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0];
          pMVar37 = (pointer)((long)local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                    m_storage.m_data.array[1] -
                              ((long)local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                     m_storage.m_data.array[1] >> 0x3f) & 0xfffffffffffffffe);
          if (1 < (long)local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[1]) {
            lVar42 = 0;
            do {
              pdVar11 = pdVar33 + lVar42;
              dVar39 = pdVar11[1];
              *(double *)
               ((long)local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array[0] + lVar42 * 8) = *pdVar11;
              ((double *)
              ((long)local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0] + lVar42 * 8))[1] = dVar39;
              lVar42 = lVar42 + 2;
            } while (lVar42 < (long)pMVar37);
          }
          if ((long)pMVar37 <
              (long)local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array[1]) {
            do {
              *(double *)
               ((long)local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array[0] + (long)pMVar37 * 8) = pdVar33[(long)pMVar37];
              pMVar37 = (pointer)((long)&(pMVar37->
                                         super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                                         ).m_storage + 1);
            } while ((pointer)local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[1] != pMVar37);
          }
          if (0 < (long)local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[1]) {
            lVar42 = *(long *)(pCVar12 + 0x78);
            pdVar33 = (double *)(*(long *)(pCVar12 + 0x70) + 0x20);
            pMVar37 = (pointer)0x0;
            do {
              *(double *)
               ((long)local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array[0] + (long)pMVar37 * 8) =
                   *(double *)
                    ((long)local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                           m_data.array[0] + (long)pMVar37 * 8) -
                   (*(double *)
                     ((long)&(pSVar34->super_Matrix<double,_6,_1,_0,_6,_1>).
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) *
                    pdVar33[1] +
                    *(double *)
                     ((long)&(pSVar34->super_Matrix<double,_6,_1,_0,_6,_1>).
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18) *
                    pdVar33[-1] +
                    *(double *)
                     ((long)&(pSVar34->super_Matrix<double,_6,_1,_0,_6,_1>).
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) *
                    pdVar33[-3] +
                   *(double *)
                    ((long)&(pSVar34->super_Matrix<double,_6,_1,_0,_6,_1>).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) *
                   *pdVar33 +
                   *(double *)
                    ((long)&(pSVar34->super_Matrix<double,_6,_1,_0,_6,_1>).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) *
                   pdVar33[-2] +
                   *(double *)
                    &(pSVar34->super_Matrix<double,_6,_1,_0,_6,_1>).
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> * pdVar33[-4]);
              pMVar37 = (pointer)((long)&(pMVar37->
                                         super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                                         ).m_storage + 1);
              pdVar33 = pdVar33 + lVar42;
            } while ((pointer)local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[1] != pMVar37);
          }
          if (*(pointer *)(pCVar12 + 0xc0) !=
              (pointer)local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[1]) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(pCVar12 + 0xb8),
                       (Index)local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[1],1);
          }
          lVar42 = *(long *)(pCVar12 + 0xb8);
          uVar41 = *(ulong *)(pCVar12 + 0xc0);
          uVar38 = uVar41 - ((long)uVar41 >> 0x3f) & 0xfffffffffffffffe;
          if (1 < (long)uVar41) {
            lVar32 = 0;
            do {
              puVar1 = (undefined8 *)((long)dVar45 + lVar32 * 8);
              uVar30 = puVar1[1];
              puVar2 = (undefined8 *)(lVar42 + lVar32 * 8);
              *puVar2 = *puVar1;
              puVar2[1] = uVar30;
              lVar32 = lVar32 + 2;
            } while (lVar32 < (long)uVar38);
          }
          if ((long)uVar38 < (long)uVar41) {
            do {
              *(undefined8 *)(lVar42 + uVar38 * 8) = *(undefined8 *)((long)dVar45 + uVar38 * 8);
              uVar38 = uVar38 + 1;
            } while (uVar41 != uVar38);
          }
          free((void *)local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0]);
          uVar41 = local_3d0;
          if (uVar40 != 0) {
            local_3c8._0_8_ =
                 (model->IA).
                 super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                 super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar31;
            local_3c8._16_8_ =
                 (model->mCustomJoints).
                 super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_3d0];
            local_3c8._8_8_ = local_3c8._16_8_ + 0x88;
            local_3c8._16_8_ = local_3c8._16_8_ + 0xa0;
            local_3c8._24_8_ = local_3c8._8_8_;
            SpatialMatrix_t::
            SpatialMatrix_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,6,0,6,6>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>const>>
                      (&local_2a8,
                       (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>_>
                        *)local_3c8);
            local_3c8._8_8_ =
                 (model->pA).
                 super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar31;
            local_3c8._24_8_ =
                 (model->c).
                 super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar31;
            local_390 = (model->mCustomJoints).
                        super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar41];
            pCStack_3a0 = local_390 + 0x88;
            local_398 = local_390 + 0xa0;
            local_390 = local_390 + 0xb8;
            local_3c8._16_8_ = &local_2a8;
            SpatialVector_t::
            SpatialVector_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>const>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>>
                      (&local_188,
                       (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                        *)local_3c8);
            Math::SpatialTransform::toMatrixTranspose
                      ((SpatialMatrix *)local_3c8,
                       (model->X_lambda).
                       super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar31);
            Math::SpatialTransform::toMatrix
                      ((SpatialMatrix *)&local_158,
                       (model->X_lambda).
                       super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar31);
            local_3e8.m_lhs.m_lhs = (LhsNested)local_3c8;
            local_3e8.m_lhs.m_rhs = &local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>;
            local_3e8.m_rhs = (RhsNested)&local_158;
            Eigen::internal::
            call_dense_assignment_loop<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,6,0,6,6>,0>,Eigen::Matrix<double,6,6,0,6,6>,1>,Eigen::internal::add_assign_op<double,double>>
                      (&(model->IA).
                        super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                        super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar40].
                        super_Matrix<double,_6,_6,_0,_6,_6>,&local_3e8,&local_409);
            Math::SpatialTransform::applyTranspose
                      ((model->X_lambda).
                       super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar31,&local_188);
            pSVar34 = (model->pA).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            dVar45 = (double)local_3c8._8_8_ +
                     *(double *)
                      ((long)&pSVar34[uVar40].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
            auVar17._8_4_ = SUB84(dVar45,0);
            auVar17._0_8_ =
                 (double)local_3c8._0_8_ +
                 *(double *)
                  &pSVar34[uVar40].super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
            auVar17._12_4_ = (int)((ulong)dVar45 >> 0x20);
            *(undefined1 (*) [16])
             &pSVar34[uVar40].super_Matrix<double,_6,_1,_0,_6,_1>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = auVar17;
            pdVar33 = (double *)
                      ((long)&pSVar34[uVar40].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
            dVar45 = (double)local_3c8._24_8_ + pdVar33[1];
            auVar18._8_4_ = SUB84(dVar45,0);
            auVar18._0_8_ = (double)local_3c8._16_8_ + *pdVar33;
            auVar18._12_4_ = (int)((ulong)dVar45 >> 0x20);
            *(undefined1 (*) [16])
             ((long)&pSVar34[uVar40].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = auVar18;
            pdVar33 = (double *)
                      ((long)&pSVar34[uVar40].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
            dVar45 = (double)pCStack_3a0 + pdVar33[1];
            auVar19._8_4_ = SUB84(dVar45,0);
            auVar19._0_8_ = (double)local_3c8._32_8_ + *pdVar33;
            auVar19._12_4_ = (int)((ulong)dVar45 >> 0x20);
            *(undefined1 (*) [16])
             ((long)&pSVar34[uVar40].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = auVar19;
          }
          free(local_408.m_storage.m_data);
        }
      }
      uVar31 = uVar31 - 1;
    } while ((int)uVar31 != 0);
  }
  dVar45 = (model->gravity).super_Vector3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  pSVar34 = (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
            super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
            super__Vector_impl_data._M_start;
  dVar39 = (model->gravity).super_Vector3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
  dVar5 = (model->gravity).super_Vector3d.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  *(undefined8 *)
   &(pSVar34->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
  *(double *)
   ((long)&(pSVar34->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
  *(double *)
   ((long)&(pSVar34->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = 0.0;
  *(double *)
   ((long)&(pSVar34->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18) = -dVar39;
  *(double *)
   ((long)&(pSVar34->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = -dVar5;
  *(double *)
   ((long)&(pSVar34->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) = -dVar45;
  if (1 < (ulong)(((long)(model->mBodies).
                         super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         .
                         super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(model->mBodies).
                         super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         .
                         super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7)) {
    uVar31 = 1;
    do {
      uVar35 = (model->mJoints).
               super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               .
               super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar31].q_index;
      uVar9 = (model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar31];
      pSVar13 = (model->X_lambda).
                super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                .
                super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar43 = pSVar13 + uVar31;
      pSVar44 = (SpatialTransform *)&local_2a8;
      for (lVar42 = 9; lVar42 != 0; lVar42 = lVar42 + -1) {
        (pSVar44->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[0] = *(double *)&(pSVar43->E).super_Matrix3d;
        pSVar43 = (pointer)((long)pSVar43 + ((ulong)bVar46 * -2 + 1) * 8);
        pSVar44 = (SpatialTransform *)((long)pSVar44 + (ulong)bVar46 * -0x10 + 8);
      }
      local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xb] =
           *(double *)((long)&pSVar13[uVar31].r.super_Vector3d + 0x10);
      local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[9] =
           *(double *)
            &pSVar13[uVar31].r.super_Vector3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
      local_2a8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[10] =
           *(double *)
            ((long)&pSVar13[uVar31].r.super_Vector3d.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8);
      Math::SpatialTransform::apply
                ((SpatialTransform *)&local_2a8,
                 (model->a).
                 super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar9);
      pSVar34 = (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pSVar14 = (model->c).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      dVar45 = (double)local_3c8._8_8_ +
               *(double *)
                ((long)&pSVar14[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
      auVar20._8_4_ = SUB84(dVar45,0);
      auVar20._0_8_ =
           (double)local_3c8._0_8_ +
           *(double *)
            &pSVar14[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
      auVar20._12_4_ = (int)((ulong)dVar45 >> 0x20);
      *(undefined1 (*) [16])
       &pSVar34[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = auVar20;
      pdVar33 = (double *)
                ((long)&pSVar14[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
      dVar45 = (double)local_3c8._24_8_ + pdVar33[1];
      auVar21._8_4_ = SUB84(dVar45,0);
      auVar21._0_8_ = (double)local_3c8._16_8_ + *pdVar33;
      auVar21._12_4_ = (int)((ulong)dVar45 >> 0x20);
      *(undefined1 (*) [16])
       ((long)&pSVar34[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = auVar21;
      pdVar33 = (double *)
                ((long)&pSVar14[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
      dVar45 = (double)pCStack_3a0 + pdVar33[1];
      auVar22._8_4_ = SUB84(dVar45,0);
      auVar22._0_8_ = (double)local_3c8._32_8_ + *pdVar33;
      auVar22._12_4_ = (int)((ulong)dVar45 >> 0x20);
      *(undefined1 (*) [16])
       ((long)&pSVar34[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = auVar22;
      pJVar10 = (model->mJoints).
                super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                .
                super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pJVar10[uVar31].mDoFCount == 1) {
        if (pJVar10[uVar31].mJointType == JointTypeCustom) goto LAB_0013e554;
        pSVar34 = (model->a).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pSVar14 = (model->U).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pdVar33 = (double *)
                  ((long)&pSVar14[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        pdVar11 = (double *)
                  ((long)&pSVar14[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        pdVar3 = (double *)
                 ((long)&pSVar34[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        pdVar4 = (double *)
                 ((long)&pSVar34[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar39 = ((model->u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data[uVar31] -
                 (pdVar11[1] * pdVar4[1] + pdVar33[1] * pdVar3[1] +
                  *(double *)
                   ((long)&pSVar14[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) *
                  *(double *)
                   ((long)&pSVar34[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) +
                 *pdVar11 * *pdVar4 + *pdVar33 * *pdVar3 +
                 *(double *)
                  &pSVar14[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *
                 *(double *)
                  &pSVar34[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>)) *
                 (1.0 / (model->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data[uVar31]);
        (local_3f8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
        [uVar35] = dVar39;
        pSVar14 = (model->S).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        dVar5 = *(double *)
                 ((long)&pSVar14[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
        dVar45 = *(double *)
                  ((long)&pSVar34[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
        *(double *)
         &pSVar34[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
             *(double *)
              &pSVar14[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> * dVar39 +
             *(double *)
              &pSVar34[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
        *(double *)
         ((long)&pSVar34[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
             dVar5 * dVar39 + dVar45;
        pdVar33 = (double *)
                  ((long)&pSVar14[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        dVar5 = pdVar33[1];
        pdVar11 = (double *)
                  ((long)&pSVar34[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        dVar45 = pdVar11[1];
        pdVar3 = (double *)
                 ((long)&pSVar34[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        *pdVar3 = *pdVar33 * dVar39 + *pdVar11;
        pdVar3[1] = dVar5 * dVar39 + dVar45;
        pdVar33 = (double *)
                  ((long)&pSVar14[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        pdVar11 = (double *)
                  ((long)&pSVar34[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar45 = dVar39 * pdVar33[1] + pdVar11[1];
        auVar23._8_4_ = SUB84(dVar45,0);
        auVar23._0_8_ = dVar39 * *pdVar33 + *pdVar11;
        auVar23._12_4_ = (int)((ulong)dVar45 >> 0x20);
        *(undefined1 (*) [16])
         ((long)&pSVar34[uVar31].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = auVar23;
      }
      else if ((pJVar10[uVar31].mDoFCount == 3) && (pJVar10[uVar31].mJointType != JointTypeCustom))
      {
        local_3c8._0_8_ =
             (model->multdof3_Dinv).super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>.
             _M_impl.super__Vector_impl_data._M_start + uVar31;
        local_3c8._8_8_ =
             (model->multdof3_u).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl.
             super__Vector_impl_data._M_start + uVar31;
        local_3c8._16_8_ =
             (model->multdof3_U).
             super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar31;
        local_3c8._24_8_ =
             (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start + uVar31;
        Vector3_t::
        Vector3_t<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,Eigen::Matrix<double,6,1,0,6,1>,0>const>,0>>
                  ((Vector3_t *)&local_158,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_0>_>
                    *)local_3c8);
        pdVar33 = (local_3f8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_data;
        pdVar33[uVar35] =
             local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0];
        pdVar33[uVar35 + 1] =
             local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1];
        pdVar33[uVar35 + 2] =
             local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2];
        local_3c8._0_8_ =
             (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start + uVar31;
        local_3c8._8_8_ =
             (model->multdof3_S).
             super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar31;
        local_3c8._16_8_ = &local_158;
        SpatialVector_t::operator=
                  ((SpatialVector_t *)local_3c8._0_8_,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                    *)local_3c8);
      }
      else {
LAB_0013e554:
        if (pJVar10[uVar31].mJointType == JointTypeCustom) {
          uVar9 = pJVar10[uVar31].custom_joint_index;
          dVar45 = (double)(ulong)*(uint *)((model->mCustomJoints).
                                            super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar9] + 8);
          local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
               0.0;
          local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
               0.0;
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_158,
                     (Index)dVar45,1);
          if (local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1]
              != dVar45) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_158,
                       (Index)dVar45,1);
          }
          if (0 < (long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[1]) {
            memset((void *)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                           m_data.array[0],0,
                   (long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                         m_data.array[1] << 3);
          }
          local_3c8._16_8_ =
               (model->mCustomJoints).
               super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar9];
          local_3c8._0_8_ = local_3c8._16_8_ + 0xa0;
          local_3c8._8_8_ = local_3c8._16_8_ + 0xb8;
          local_3c8._16_8_ = local_3c8._16_8_ + 0x88;
          local_3c8._24_8_ =
               (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar31;
          Eigen::internal::
          call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,6,1,0,6,1>,0>const>,0>,Eigen::internal::assign_op<double,double>>
                    ((Matrix<double,__1,_1,_0,__1,_1> *)&local_158,
                     (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_0>
                      *)local_3c8,(assign_op<double,_double> *)&local_188,(type)0x0);
          if (dVar45 != 0.0) {
            pdVar33 = (local_3f8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data;
            dVar39 = 0.0;
            do {
              pdVar33[uVar35 + SUB84(dVar39,0)] =
                   *(double *)
                    ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                           m_data.array[0] + (long)dVar39 * 8);
              dVar39 = (double)((long)dVar39 + 1);
            } while (dVar45 != dVar39);
          }
          local_3c8._0_8_ =
               (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar31;
          local_3c8._8_8_ =
               (model->mCustomJoints).
               super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar9] + 0x70;
          local_3c8._16_8_ = &local_158;
          SpatialVector_t::operator=
                    ((SpatialVector_t *)local_3c8._0_8_,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                      *)local_3c8);
          free((void *)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0]);
        }
      }
      uVar31 = (ulong)((int)uVar31 + 1);
      uVar40 = ((long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
    } while (uVar31 <= uVar40 && uVar40 - uVar31 != 0);
  }
  return;
}

Assistant:

RBDL_DLLAPI
void ForwardDynamicsApplyConstraintForces (
  Model &model,
  const VectorNd &Tau,
  ConstraintSet &CS,
  VectorNd &QDDot
)
{
  LOG << "-------- " << __func__ << " --------" << std::endl;
  assert (QDDot.size() == model.dof_count);

  unsigned int i = 0;

  for (i = 1; i < model.mBodies.size(); i++) {
    model.IA[i] = model.I[i].toMatrix();;
    model.pA[i] = crossf(model.v[i],model.I[i] * model.v[i]);

#ifdef RBDL_USE_CASADI_MATH
    {
#else
    if (CS.f_ext_constraints[i] != SpatialVector::Zero()) {
#endif
      LOG << "External force (" << i << ") = "
          << model.X_base[i].toMatrixAdjoint() * CS.f_ext_constraints[i]
          << std::endl;
      model.pA[i] -= model.X_base[i].toMatrixAdjoint()*CS.f_ext_constraints[i];
    }
  }

  // ClearLogOutput();

  LOG << "--- first loop ---" << std::endl;

  for (i = model.mBodies.size() - 1; i > 0; i--) {
    unsigned int q_index = model.mJoints[i].q_index;

    if (model.mJoints[i].mDoFCount == 3
        && model.mJoints[i].mJointType != JointTypeCustom) {
      unsigned int lambda = model.lambda[i];
      model.multdof3_u[i] = Vector3d (Tau[q_index],
                                      Tau[q_index + 1],
                                      Tau[q_index + 2])
                            - model.multdof3_S[i].transpose() * model.pA[i];

      if (lambda != 0) {
        SpatialMatrix Ia = model.IA[i] - (model.multdof3_U[i]
                                          * model.multdof3_Dinv[i]
                                          * model.multdof3_U[i].transpose());

        SpatialVector pa = model.pA[i] + Ia * model.c[i]
                           + model.multdof3_U[i] * model.multdof3_Dinv[i] * model.multdof3_u[i];

#ifdef RBDL_USE_CASADI_MATH
        model.IA[lambda] += (model.X_lambda[i].toMatrixTranspose()
                                       * Ia * model.X_lambda[i].toMatrix());
        model.pA[lambda] += model.X_lambda[i].applyTranspose(pa);
#else
        model.IA[lambda].noalias() += (model.X_lambda[i].toMatrixTranspose()
                                       * Ia * model.X_lambda[i].toMatrix());
        model.pA[lambda].noalias() += model.X_lambda[i].applyTranspose(pa);
#endif

        LOG << "pA[" << lambda << "] = " << model.pA[lambda].transpose()
            << std::endl;
      }
    } else if (model.mJoints[i].mDoFCount == 1
               && model.mJoints[i].mJointType != JointTypeCustom) {
      model.u[i] = Tau[q_index] - model.S[i].dot(model.pA[i]);

      unsigned int lambda = model.lambda[i];
      if (lambda != 0) {
        SpatialMatrix Ia = model.IA[i]
                           - model.U[i] * (model.U[i] / model.d[i]).transpose();
        SpatialVector pa =  model.pA[i] + Ia * model.c[i]
                            + model.U[i] * model.u[i] / model.d[i];
#ifdef RBDL_USE_CASADI_MATH
        model.IA[lambda] += (model.X_lambda[i].toMatrixTranspose()
                                       * Ia * model.X_lambda[i].toMatrix());
        model.pA[lambda] += model.X_lambda[i].applyTranspose(pa);
#else
        model.IA[lambda].noalias() += (model.X_lambda[i].toMatrixTranspose()
                                       * Ia * model.X_lambda[i].toMatrix());
        model.pA[lambda].noalias() += model.X_lambda[i].applyTranspose(pa);
#endif

        LOG << "pA[" << lambda << "] = "
            << model.pA[lambda].transpose() << std::endl;
      }
    } else if(model.mJoints[i].mJointType == JointTypeCustom) {

      unsigned int kI     = model.mJoints[i].custom_joint_index;
      unsigned int dofI   = model.mCustomJoints[kI]->mDoFCount;
      unsigned int lambda = model.lambda[i];
      VectorNd tau_temp = VectorNd::Zero(dofI);

      for(int z=0; z<dofI; ++z) {
        tau_temp[z] = Tau[q_index+z];
      }

      model.mCustomJoints[kI]->u = tau_temp
                                   - (model.mCustomJoints[kI]->S.transpose()
                                      * model.pA[i]);

      if (lambda != 0) {
        SpatialMatrix Ia = model.IA[i]
                           - (   model.mCustomJoints[kI]->U
                                 * model.mCustomJoints[kI]->Dinv
                                 * model.mCustomJoints[kI]->U.transpose());

        SpatialVector pa = model.pA[i] + Ia * model.c[i]
                           + ( model.mCustomJoints[kI]->U
                               * model.mCustomJoints[kI]->Dinv
                               * model.mCustomJoints[kI]->u );

#ifdef RBDL_USE_CASADI_MATH
        model.IA[lambda] += model.X_lambda[i].toMatrixTranspose()
                                      * Ia * model.X_lambda[i].toMatrix();

        model.pA[lambda] += model.X_lambda[i].applyTranspose(pa);
#else
        model.IA[lambda].noalias() += model.X_lambda[i].toMatrixTranspose()
                                      * Ia * model.X_lambda[i].toMatrix();

        model.pA[lambda].noalias() += model.X_lambda[i].applyTranspose(pa);
#endif

        LOG << "pA[" << lambda << "] = " << model.pA[lambda].transpose()
            << std::endl;
      }
    }
  }

  model.a[0] = SpatialVector (0., 0., 0.,
                              -model.gravity[0],
                              -model.gravity[1],
                              -model.gravity[2]);

  for (i = 1; i < model.mBodies.size(); i++) {
    unsigned int q_index = model.mJoints[i].q_index;
    unsigned int lambda = model.lambda[i];
    SpatialTransform X_lambda = model.X_lambda[i];

    model.a[i] = X_lambda.apply(model.a[lambda]) + model.c[i];
    LOG << "a'[" << i << "] = " << model.a[i].transpose() << std::endl;

    if (model.mJoints[i].mDoFCount == 3
        && model.mJoints[i].mJointType != JointTypeCustom) {
      Vector3d qdd_temp = model.multdof3_Dinv[i] *
                          (model.multdof3_u[i]
                           - model.multdof3_U[i].transpose() * model.a[i]);

      QDDot[q_index] = qdd_temp[0];
      QDDot[q_index + 1] = qdd_temp[1];
      QDDot[q_index + 2] = qdd_temp[2];
      model.a[i] = model.a[i] + model.multdof3_S[i] * qdd_temp;
    } else if (model.mJoints[i].mDoFCount == 1
               && model.mJoints[i].mJointType != JointTypeCustom) {
      QDDot[q_index] = (1./model.d[i]) * (
                         model.u[i] - model.U[i].dot(model.a[i]));
      model.a[i] = model.a[i] + model.S[i] * QDDot[q_index];
    } else if (model.mJoints[i].mJointType == JointTypeCustom) {
      unsigned int kI     = model.mJoints[i].custom_joint_index;
      unsigned int dofI   = model.mCustomJoints[kI]->mDoFCount;
      VectorNd qdd_temp = VectorNd::Zero(dofI);

      qdd_temp = model.mCustomJoints[kI]->Dinv
                 * (model.mCustomJoints[kI]->u
                    - model.mCustomJoints[kI]->U.transpose()
                    * model.a[i]);

      for(int z=0; z<dofI; ++z) {
        QDDot[q_index+z] = qdd_temp[z];
      }

      model.a[i] = model.a[i] + (model.mCustomJoints[kI]->S * qdd_temp);
    }
  }

  LOG << "QDDot = " << QDDot.transpose() << std::endl;
}

//==============================================================================
/** @brief Computes the effect of external forces on the generalized
            accelerations.

    This function is essentially similar to ForwardDynamics() except that it
    tries to only perform computations of variables that change due to
    external forces defined in f_t.
 */
RBDL_DLLAPI
void ForwardDynamicsAccelerationDeltas (
  Model &model,
  ConstraintSet &CS,
  VectorNd &QDDot_t,
  const unsigned int body_id,
  const std::vector<SpatialVector> &f_t
)
{
  LOG << "-------- " << __func__ << " ------" << std::endl;

  assert (CS.d_pA.size() == model.mBodies.size());
  assert (CS.d_a.size() == model.mBodies.size());
  assert (CS.d_u.size() == model.mBodies.size());

  // TODO reset all values (debug)
  for (unsigned int i = 0; i < model.mBodies.size(); i++) {
    CS.d_pA[i].setZero();
    CS.d_a[i].setZero();
    CS.d_u[i] = 0.;
    CS.d_multdof3_u[i].setZero();
  }
  for(unsigned int i=0; i<model.mCustomJoints.size(); i++) {
    model.mCustomJoints[i]->d_u.setZero();
  }

  for (unsigned int i = body_id; i > 0; i--) {
    if (i == body_id) {
      CS.d_pA[i] = -model.X_base[i].applyAdjoint(f_t[i]);
    }

    if (model.mJoints[i].mDoFCount == 3
        && model.mJoints[i].mJointType != JointTypeCustom) {
      CS.d_multdof3_u[i] = - model.multdof3_S[i].transpose() * (CS.d_pA[i]);

      unsigned int lambda = model.lambda[i];
      if (lambda != 0) {
        CS.d_pA[lambda] =   CS.d_pA[lambda]
                            + model.X_lambda[i].applyTranspose (
                              CS.d_pA[i] + (model.multdof3_U[i]
                                            * model.multdof3_Dinv[i]
                                            * CS.d_multdof3_u[i]));
      }
    } else if(model.mJoints[i].mDoFCount == 1
              && model.mJoints[i].mJointType != JointTypeCustom) {
      CS.d_u[i] = - model.S[i].dot(CS.d_pA[i]);
      unsigned int lambda = model.lambda[i];

      if (lambda != 0) {
        CS.d_pA[lambda] = CS.d_pA[lambda]
                          + model.X_lambda[i].applyTranspose (
                            CS.d_pA[i] + model.U[i] * CS.d_u[i] / model.d[i]);
      }
    } else if (model.mJoints[i].mJointType == JointTypeCustom) {

      unsigned int kI     = model.mJoints[i].custom_joint_index;
      unsigned int dofI   = model.mCustomJoints[kI]->mDoFCount;
      //CS.
      model.mCustomJoints[kI]->d_u =
        - model.mCustomJoints[kI]->S.transpose() * (CS.d_pA[i]);
      unsigned int lambda = model.lambda[i];
      if (lambda != 0) {
        CS.d_pA[lambda] =
          CS.d_pA[lambda]
          + model.X_lambda[i].applyTranspose (
            CS.d_pA[i] + (   model.mCustomJoints[kI]->U
                             * model.mCustomJoints[kI]->Dinv
                             * model.mCustomJoints[kI]->d_u)
          );
      }
    }
  }

  for (unsigned int i = 0; i < f_t.size(); i++) {
    LOG << "f_t[" << i << "] = " << f_t[i].transpose() << std::endl;
  }

  for (unsigned int i = 0; i < model.mBodies.size(); i++) {
    LOG << "i = " << i << ": d_pA[i] " << CS.d_pA[i].transpose() << std::endl;
  }
  for (unsigned int i = 0; i < model.mBodies.size(); i++) {
    LOG << "i = " << i << ": d_u[i] = " << CS.d_u[i] << std::endl;
  }

  QDDot_t[0] = 0.;
  CS.d_a[0] = model.a[0];

  for (unsigned int i = 1; i < model.mBodies.size(); i++) {
    unsigned int q_index = model.mJoints[i].q_index;
    unsigned int lambda = model.lambda[i];

    SpatialVector Xa = model.X_lambda[i].apply(CS.d_a[lambda]);

    if (model.mJoints[i].mDoFCount == 3
        && model.mJoints[i].mJointType != JointTypeCustom) {
      Vector3d qdd_temp = model.multdof3_Dinv[i]
                          * (CS.d_multdof3_u[i] - model.multdof3_U[i].transpose() * Xa);

      QDDot_t[q_index] = qdd_temp[0];
      QDDot_t[q_index + 1] = qdd_temp[1];
      QDDot_t[q_index + 2] = qdd_temp[2];
      model.a[i] = model.a[i] + model.multdof3_S[i] * qdd_temp;
      CS.d_a[i] = Xa + model.multdof3_S[i] * qdd_temp;
    } else if (model.mJoints[i].mDoFCount == 1
               && model.mJoints[i].mJointType != JointTypeCustom) {

      QDDot_t[q_index] = (CS.d_u[i] - model.U[i].dot(Xa) ) / model.d[i];
      CS.d_a[i] = Xa + model.S[i] * QDDot_t[q_index];
    } else if (model.mJoints[i].mJointType == JointTypeCustom) {
      unsigned int kI     = model.mJoints[i].custom_joint_index;
      unsigned int dofI   = model.mCustomJoints[kI]->mDoFCount;
      VectorNd qdd_temp = VectorNd::Zero(dofI);

      qdd_temp = model.mCustomJoints[kI]->Dinv
                 * (model.mCustomJoints[kI]->d_u
                    - model.mCustomJoints[kI]->U.transpose() * Xa);

      for(int z=0; z<dofI; ++z) {
        QDDot_t[q_index+z] = qdd_temp[z];
      }

      model.a[i] = model.a[i] + model.mCustomJoints[kI]->S * qdd_temp;
      CS.d_a[i] = Xa + model.mCustomJoints[kI]->S * qdd_temp;
    }

    LOG << "QDDot_t[" << i - 1 << "] = " << QDDot_t[i - 1] << std::endl;
    LOG << "d_a[i] = " << CS.d_a[i].transpose() << std::endl;
  }
}

inline void set_zero (std::vector<SpatialVector> &spatial_values)
{
  for (unsigned int i = 0; i < spatial_values.size(); i++) {
    spatial_values[i].setZero();
  }
}

//==============================================================================
RBDL_DLLAPI
void ForwardDynamicsContactsKokkevis (
  Model &model,
  const VectorNd &Q,
  const VectorNd &QDot,
  const VectorNd &Tau,
  ConstraintSet &CS,
  VectorNd &QDDot
)
{
  LOG << "-------- " << __func__ << " ------" << std::endl;

  assert (CS.f_ext_constraints.size() == model.mBodies.size());
  assert (CS.QDDot_0.size() == model.dof_count);
  assert (CS.QDDot_t.size() == model.dof_count);
  assert (CS.f_t.size() == CS.size());
  assert (CS.point_accel_0.size() == CS.size());
  assert (CS.K.rows() == CS.size());
  assert (CS.K.cols() == CS.size());
  assert (CS.force.size() == CS.size());
  assert (CS.a.size() == CS.size());

  if(CS.constraints.size() != CS.contactConstraints.size()) {
    std::stringstream errormsg;
    errormsg << "Incompatible constraint types: all constraints"
             << " must be ContactConstraints for the Kokkevis method"
             << std::endl;
    throw Errors::RBDLError(errormsg.str());
  }

  Vector3d point_accel_t;

  unsigned int ci = 0; //constraint index:
  // the row index in the constraint Jacobian.

  // The default acceleration only needs to be computed once
  {
    SUPPRESS_LOGGING;
    ForwardDynamics(model, Q, QDot, Tau, CS.QDDot_0);
  }

  LOG << "=== Initial Loop Start ===" << std::endl;
  // we have to compute the standard accelerations first as we use them to
  // compute the effects of each test force
  unsigned int bi = 0;
  for(bi =0; bi < CS.contactConstraints.size(); ++bi) {
    {
      SUPPRESS_LOGGING;
      UpdateKinematicsCustom(model, NULL, NULL, &CS.QDDot_0);
    }
    {
      LOG << "body_id = "
          << CS.contactConstraints[bi]->getBodyIds()[0]
          << std::endl;
      LOG << "point = "
          << CS.contactConstraints[bi]->getBodyFrames()[0].r
          << std::endl;
      LOG << "QDDot_0 = " << CS.QDDot_0.transpose() << std::endl;
    }
    {
      SUPPRESS_LOGGING;
      CS.contactConstraints[bi]->calcPointAccelerations(
        model,Q,QDot,CS.QDDot_0,CS.point_accel_0,false);
      CS.contactConstraints[bi]->calcPointAccelerationError(
        CS.point_accel_0,CS.a);
    }
  }

  // K: ContactConstraints
  unsigned int cj=0;
  unsigned int movable_body_id = 0;
  Vector3d point_global;

  for (bi = 0; bi < CS.contactConstraints.size(); bi++) {

    LOG << "=== Testforce Loop Start ===" << std::endl;

    ci = CS.contactConstraints[bi]->getConstraintIndex();

    movable_body_id = GetMovableBodyId(model,
                                       CS.contactConstraints[bi]->getBodyIds()[0]);

    // assemble the test force
    LOG << "point_global = " << point_global.transpose() << std::endl;

    CS.contactConstraints[bi]->calcPointForceJacobian(
      model,Q,CS.cache,CS.f_t,false);

    for(unsigned int j = 0; j<CS.contactConstraints[bi]
        ->getConstraintNormalVectors().size(); ++j) {

      CS.f_ext_constraints[movable_body_id] = CS.f_t[ci+j];

      LOG << "f_t[" << movable_body_id << "] = " << CS.f_t[ci+j].transpose()
          << std::endl;
      {
        ForwardDynamicsAccelerationDeltas(model, CS, CS.QDDot_t
                                          , movable_body_id, CS.f_ext_constraints);

        LOG << "QDDot_0 = " << CS.QDDot_0.transpose() << std::endl;
        LOG << "QDDot_t = " << (CS.QDDot_t + CS.QDDot_0).transpose()
            << std::endl;
        LOG << "QDDot_t - QDDot_0 = " << (CS.QDDot_t).transpose() << std::endl;
      }

      CS.f_ext_constraints[movable_body_id].setZero();

      CS.QDDot_t += CS.QDDot_0;
      // compute the resulting acceleration
      {
        SUPPRESS_LOGGING;
        UpdateKinematicsCustom(model, NULL, NULL, &CS.QDDot_t);
      }

      for(unsigned int dj = 0;
          dj < CS.contactConstraints.size(); dj++) {

        cj = CS.contactConstraints[dj]->getConstraintIndex();
        {
          SUPPRESS_LOGGING;
          CS.contactConstraints[dj]->calcPointAccelerations(
            model,Q,QDot,CS.QDDot_t,point_accel_t,false);
        }

        LOG << "point_accel_0  = " << CS.point_accel_0[ci+j].transpose()
            << std::endl;
        LOG << "point_accel_t = " << point_accel_t.transpose() << std::endl;
        for(unsigned int k=0;
            k < CS.contactConstraints[dj]
            ->getConstraintNormalVectors().size(); ++k) {

          CS.K(ci+j,cj+k) = CS.contactConstraints[dj]
                            ->getConstraintNormalVectors()[k].dot(
                              point_accel_t - CS.point_accel_0[cj+k]);
        }
      }
    }
  }




  LOG << "K = " << std::endl << CS.K << std::endl;
  LOG << "a = " << std::endl << CS.a << std::endl;

#ifdef RBDL_USE_CASADI_MATH
    auto linsol = casadi::Linsol("linear_solver", "symbolicqr", CS.K.sparsity());
    CS.force = linsol.solve(CS.K, CS.a);
#else
  switch (CS.linear_solver) {
  case (LinearSolverPartialPivLU) :
    CS.force = CS.K.partialPivLu().solve(CS.a);
    break;
  case (LinearSolverColPivHouseholderQR) :
    CS.force = CS.K.colPivHouseholderQr().solve(CS.a);
    break;
  case (LinearSolverHouseholderQR) :
    CS.force = CS.K.householderQr().solve(CS.a);
    break;
  default:
    LOG << "Error: Invalid linear solver: " << CS.linear_solver << std::endl;
    assert (0);
    break;
  }
#endif

  LOG << "f = " << CS.force.transpose() << std::endl;


  for(bi=0; bi<CS.contactConstraints.size(); ++bi) {
    unsigned int body_id =
      CS.contactConstraints[bi]->getBodyIds()[0];
    unsigned int movable_body_id = body_id;

    if (model.IsFixedBodyId(body_id)) {
      unsigned int fbody_id = body_id - model.fixed_body_discriminator;
      movable_body_id = model.mFixedBodies[fbody_id].mMovableParent;
    }
    ci = CS.contactConstraints[bi]->getConstraintIndex();

    for(unsigned int k=0;
        k<CS.contactConstraints[bi]->getConstraintSize(); ++k) {
      CS.f_ext_constraints[movable_body_id] -= CS.f_t[ci+k] * CS.force[ci+k];
      LOG << "f_ext[" << movable_body_id << "] = "
          << CS.f_ext_constraints[movable_body_id].transpose() << std::endl;
    }

  }



  {
    SUPPRESS_LOGGING;
    ForwardDynamicsApplyConstraintForces (model, Tau, CS, QDDot);
  }

  LOG << "QDDot after applying f_ext: " << QDDot.transpose() << std::endl;
}


//==============================================================================
#ifndef RBDL_USE_CASADI_MATH
RBDL_DLLAPI
bool isConstrainedSystemFullyActuated(
  Model &model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  ConstraintSet &CS,
  std::vector<Math::SpatialVector> *f_ext)
{

  LOG << "-------- " << __func__ << " ------" << std::endl;


  assert (CS.S.cols()    == QDot.rows());

  unsigned int n  = unsigned(    CS.H.rows());
  unsigned int nc = unsigned( CS.name.size());
  unsigned int na = unsigned(    CS.S.rows());
  unsigned int nu = n-na;


  CalcConstrainedSystemVariables(model,Q,QDot,VectorNd::Zero(QDot.rows()),CS,
                                 f_ext);

  CS.GPT = CS.G*CS.P.transpose();

  CS.GPT_full_qr.compute(CS.GPT);
  unsigned int r = unsigned(CS.GPT_full_qr.rank());

  bool isCompatible = false;
  if(r == (n-na)) {
    isCompatible = true;
  } else {
    isCompatible = false;
  }

  return isCompatible;

}
#endif

RBDL_DLLAPI
void InverseDynamicsConstraints(
  Model &model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  const Math::VectorNd &QDDotDesired,
  ConstraintSet &CS,
  Math::VectorNd &QDDotOutput,
  Math::VectorNd &TauOutput,
  std::vector<Math::SpatialVector> *f_ext)
{

  LOG << "-------- " << __func__ << " ------" << std::endl;

  assert (QDot.size()         == QDDotDesired.size());
  assert (QDDotDesired.size() == QDot.size());
  assert (QDDotOutput.size()  == QDot.size());
  assert (TauOutput.size()    == CS.H.rows());

  assert (CS.S.cols()     == QDDotDesired.rows());

  unsigned int n  = unsigned(    CS.H.rows());
  unsigned int nc = unsigned( CS.name.size());
  unsigned int na = unsigned(    CS.S.rows());
  unsigned int nu = n-na;

  TauOutput.setZero();
  CalcConstrainedSystemVariables(model,Q,QDot,TauOutput,CS,f_ext);

  // This implementation follows the projected KKT system described in
  // Eqn. 5.20 of Henning Koch's thesis work. Note that this will fail
  // for under actuated systems
  //  [ SMS'      SMP'    SJ'    I][      u]   [ -SC    ]
  //  [ PMS'      PMP'    PJ'     ][      v] = [ -PC    ]
  //  [ JS'        JP'     0      ][-lambda]   [ -gamma ]
  //  [ I                         ][   -tau]   [  v*     ]
  //double alpha = 0.1;

  CS.Ful = CS.S*CS.H*CS.S.transpose();
  CS.Fur = CS.S*CS.H*CS.P.transpose();
  CS.Fll = CS.P*CS.H*CS.S.transpose();
  CS.Flr = CS.P*CS.H*CS.P.transpose();

  CS.GTu = CS.S*(CS.G.transpose());
  CS.GTl = CS.P*(CS.G.transpose());

  //Exploiting the block triangular structure
  //u:
  //I u = S*qdd*
  CS.u = CS.S*QDDotDesired;
  // v
  //(JP')v = -gamma - (JS')u
  //Using GT

  //This fails using SimpleMath and I'm not sure how to fix it
  SolveLinearSystem( CS.GTl.transpose(),
                     CS.gamma - CS.GTu.transpose()*CS.u,
                     CS.v, CS.linear_solver);

  // lambda
  SolveLinearSystem(CS.GTl,
                    -CS.P*CS.C
                    - CS.Fll*CS.u
                    - CS.Flr*CS.v,
                    CS.force,
                    CS.linear_solver);

  for(unsigned int i=0; i<CS.force.rows(); ++i) {
    CS.force[i] *= -1.0;
  }

  //Evaluating qdd
  QDDotOutput = CS.S.transpose()*CS.u + CS.P.transpose()*CS.v;

  //Evaluating tau
  TauOutput = -CS.S.transpose()*( -CS.S*CS.C
                                  -( CS.Ful*CS.u
                                     +CS.Fur*CS.v
                                     -CS.GTu*CS.force));




}

#ifndef RBDL_USE_CASADI_MATH
RBDL_DLLAPI
void InverseDynamicsConstraintsRelaxed(
  Model &model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  const Math::VectorNd &QDDotControls,
  ConstraintSet &CS,
  Math::VectorNd &QDDotOutput,
  Math::VectorNd &TauOutput,
  std::vector<Math::SpatialVector> *f_ext)
{
  LOG << "-------- " << __func__ << " --------" << std::endl;

  //Check that the input vectors and matricies are sized appropriately
  assert(Q.size()               == model.q_size);
  assert(QDot.size()            == model.qdot_size);
  assert(QDDotControls.size()    == model.dof_count);
  assert(CS.S.cols()            == model.dof_count);
  assert(CS.W.rows()            == CS.W.cols());
  assert(CS.W.rows()            == CS.S.rows());
  assert(QDDotOutput.size()     == model.dof_count);

  TauOutput.setZero();
  CalcConstrainedSystemVariables(model,Q,QDot,TauOutput,CS,f_ext);

  unsigned int n  = unsigned(    CS.H.rows());
  unsigned int nc = unsigned( CS.name.size());
  unsigned int na = unsigned(    CS.S.rows());
  unsigned int nu = n-na;

  //MM 2020/5/29:
  //  The updates I made to Henning's original formulation have
  //  almost certainly made the sensitivity of the resulting qdd
  //  w.r.t. the controls poorly scaled. At least this is a suspicion
  //  of mine looking at how an OCP is behaving when using this operator.
  //  Reverting to the original formulation.
  //MM: Update to Henning's formulation s.t. the relaxed IDC operator will
  //    more closely satisfy QDDotControls if it is possible.
  //double diag = 0.;//100.*CS.H.maxCoeff();
  //double diagInv = 0.;
  //for(unsigned int i=0; i<CS.H.rows(); ++i) {
  //  for(unsigned int j=0; j<CS.H.cols(); ++j) {
  //    if(fabs(CS.H(i,j)) > diag) {
  //      diag = fabs(CS.H(i,j));
  //    }
  //  }
  //}
  //diag = diag*100.;
  //diagInv = 1.0/diag;
  //for(unsigned int i=0; i<CS.W.rows(); ++i) {
  //  CS.W(i,i)    = diag;
  //  CS.Winv(i,i) = diagInv;
  //}

  CS.W = 100.0*CS.S*CS.H*CS.S.transpose();
  CS.Winv = CS.W.inverse();
  CS.WinvSC = CS.Winv * CS.S * CS.C;

  //CS.W = CS.S*CS.H*CS.S.transpose();

  CS.F.block(  0,  0, na, na) = CS.S*CS.H*CS.S.transpose() + CS.W;
  CS.F.block(  0, na, na, nu) = CS.S*CS.H*CS.P.transpose();
  CS.F.block( na,  0, nu, na) = CS.P*CS.H*CS.S.transpose();
  CS.F.block( na, na, nu, nu) = CS.P*CS.H*CS.P.transpose();

  CS.GT.block(  0, 0,na, nc) = CS.S*(CS.G.transpose());
  CS.GT.block( na, 0,nu, nc) = CS.P*(CS.G.transpose());

  CS.GT_qr.compute (CS.GT);
  CS.GT_qr.householderQ().evalTo (CS.GT_qr_Q);

  //GT = [Y  Z] * [ R ]
  //              [ 0 ]

  CS.R  = CS.GT_qr_Q.transpose()*CS.GT;
  CS.Ru = CS.R.block(0,0,nc,nc);

  CS.Y = CS.GT_qr_Q.block( 0, 0,  n, nc    );
  CS.Z = CS.GT_qr_Q.block( 0, nc, n, (n-nc));

  //MM: Update to Henning's formulation s.t. the relaxed IDC operator will
  //    exactly satisfy QDDotControls if it is possible.
  //
  //Modify QDDotControls so that SN is cancelled.
  //
  //    +SC - WS(qdd*)
  //
  // Add a term to cancel off SN
  //
  //    +SC - WS( qdd* + (S' W^-1 S)N )
  //

  CS.u = CS.S*CS.C - CS.W*(CS.S*(QDDotControls
                                 +(CS.S.transpose()*CS.WinvSC)));
  //CS.u =  CS.S*CS.C - CS.W*(CS.S*QDDotControls);
  CS.v =  CS.P*CS.C;

  for(unsigned int i=0; i<CS.S.rows(); ++i) {
    CS.g[i] = CS.u[i];
  }
  unsigned int j=CS.S.rows();
  for(unsigned int i=0; i<CS.P.rows(); ++i) {
    CS.g[j] = CS.v[i];
    ++j;
  }

  //nc x nc system
  SolveLinearSystem(CS.Ru.transpose(), CS.gamma, CS.py, CS.linear_solver);

  //(n-nc) x (n-nc) system
  SolveLinearSystem(CS.Z.transpose()*CS.F*CS.Z,
                    CS.Z.transpose()*(-CS.F*CS.Y*CS.py-CS.g),
                    CS.pz,
                    CS.linear_solver);

  //nc x nc system
  SolveLinearSystem(CS.Ru,
                    CS.Y.transpose()*(CS.g + CS.F*CS.Y*CS.py + CS.F*CS.Z*CS.pz),
                    CS.force, CS.linear_solver);

  //Eqn. 32d, the equation for qdd, is in error. Instead
  // p = Ypy + Zpz = [v,w]
  // qdd = S'v + P'w
  QDDotOutput = CS.Y*CS.py + CS.Z*CS.pz;
  for(unsigned int i=0; i<CS.S.rows(); ++i) {
    CS.u[i] = QDDotOutput[i];
  }
  j = CS.S.rows();
  for(unsigned int i=0; i<CS.P.rows(); ++i) {
    CS.v[i] = QDDotOutput[j];
    ++j;
  }

  QDDotOutput = CS.S.transpose()*CS.u
                +CS.P.transpose()*CS.v;

  TauOutput = (CS.S.transpose()*CS.W*CS.S)*(
                QDDotControls+(CS.S.transpose()*CS.WinvSC)
                -QDDotOutput);
  //TauOutput =  CS.S.transpose()*CS.W*CS.S*(QDDotControls - QDDotOutput);


}
#endif

void SolveLinearSystem (
  const MatrixNd& A,
  const VectorNd& b,
  VectorNd& x,
  LinearSolver ls
)
{
  if(A.rows() != b.size() || A.cols() != x.size()) {
    throw Errors::RBDLSizeMismatchError("Mismatching sizes.\n");
  }

#ifdef RBDL_USE_CASADI_MATH
  auto linsol = casadi::Linsol("linear_solver", "symbolicqr", A.sparsity());
  x = linsol.solve(A, b);
#else
  // Solve the system A*x = b.
  switch (ls) {
  case (LinearSolverPartialPivLU) :
    x = A.partialPivLu().solve(b);
    break;
  case (LinearSolverColPivHouseholderQR) :
    x = A.colPivHouseholderQr().solve(b);
    break;
  case (LinearSolverHouseholderQR) :
    x = A.householderQr().solve(b);
    break;
  default:
    std::ostringstream errormsg;
    errormsg << "Error: Invalid linear solver: " << ls << std::endl;
    throw Errors::RBDLError(errormsg.str());
    break;
  }
#endif
}

//==============================================================================
unsigned int GetMovableBodyId (Model& model, unsigned int id)
{
  if(model.IsFixedBodyId(id)) {
    unsigned int fbody_id = id - model.fixed_body_discriminator;
    return model.mFixedBodies[fbody_id].mMovableParent;
  } else {
    return id;
  }
}

//==============================================================================

void ConstraintSet::calcForces(
  unsigned int groupIndex,
  Model& model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  std::vector< unsigned int > &constraintBodyIdsUpd,
  std::vector< Math::SpatialTransform > &constraintBodyFramesUpd,
  std::vector< Math::SpatialVector > &constraintForcesUpd,
  bool resolveAllInRootFrame,
  bool updKin)
{
  assert(groupIndex <= unsigned(constraints.size()-1));

  if (updKin) {
    UpdateKinematicsCustom (model, &Q, &QDot, NULL);
  }

  constraints[groupIndex]->calcConstraintForces(model,0.,Q,QDot,G,force,
      constraintBodyIdsUpd,
      constraintBodyFramesUpd,
      constraintForcesUpd,
      cache,
      resolveAllInRootFrame,
      updKin);
}

//==============================================================================

void ConstraintSet::calcImpulses(
  unsigned int groupIndex,
  Model& model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  std::vector< unsigned int > &constraintBodyIdsUpd,
  std::vector< Math::SpatialTransform > &constraintBodyFramesUpd,
  std::vector< Math::SpatialVector > &constraintImpulsesUpd,
  bool resolveAllInRootFrame,
  bool updKin)
{
  assert(groupIndex <= unsigned(constraints.size()-1));

  if (updKin) {
    UpdateKinematicsCustom (model, &Q, &QDot, NULL);
  }

  //The transformation is identical to resolve the impulses
  //to the desired frame
  constraints[groupIndex]->calcConstraintForces(model,0.,Q,QDot,G,impulse,
      constraintBodyIdsUpd,
      constraintBodyFramesUpd,
      constraintImpulsesUpd,
      cache,
      resolveAllInRootFrame,
      updKin);

  //But due to Martin's choice of signs on the Lagrange multipliers vs
  //impulses the signs are opposite
  for(unsigned int i=0; i<constraintImpulsesUpd.size(); ++i) {
    constraintImpulsesUpd[i] *= -1.0;
  }
}

//==============================================================================

void ConstraintSet::calcPositionError(
  unsigned int groupIndex,
  Model& model,
  const Math::VectorNd &Q,
  Math::VectorNd &posErrUpd,
  bool updKin)
{
  assert(groupIndex <= unsigned(constraints.size()-1));

  if (updKin) {
    UpdateKinematicsCustom (model, &Q, NULL, NULL);
  }

  //Update the position errors for this constraint in the system level
  //error vector
  constraints[groupIndex]->calcPositionError(model,0.,Q,err,cache,updKin);

  //Pick out the position errors for this constraint from the system level
  //error vector.
  constraints[groupIndex]->getPositionError(err,posErrUpd);

}
//==============================================================================

void ConstraintSet::calcVelocityError(
  unsigned int groupIndex,
  Model& model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  Math::VectorNd &velErrUpd,
  bool updKin)
{
  assert(groupIndex <= unsigned(constraints.size()-1));

  if (updKin) {
    UpdateKinematicsCustom (model, &Q, &QDot, NULL);
  }

  //Update the constraint Jacobian of this constraint
  constraints[groupIndex]->calcConstraintJacobian(model,0.,Q,QDot,G,cache,
      updKin);

  //Update the velocity-level errors of this constraint
  constraints[groupIndex]->calcVelocityError(model,0.,Q,QDot,G,errd,cache,
      updKin);

  //Pick out the sub vector of velocity errors for this constraint from
  //the system error vector.
  constraints[groupIndex]->getVelocityError(errd,velErrUpd);

}
//==============================================================================

void ConstraintSet::calcBaumgarteStabilizationForces(
  unsigned int groupIndex,
  Model& model,
  const Math::VectorNd &positionError,
  const Math::VectorNd &velocityError,
  Math::VectorNd &baumgarteForces)
{
  assert(groupIndex <= unsigned(constraints.size()-1));
  assert(positionError.rows() == constraints[groupIndex]->getConstraintSize());
  assert(velocityError.rows() == constraints[groupIndex]->getConstraintSize());

  constraints[groupIndex]->getBaumgarteStabilizationForces(positionError,
      velocityError,
      baumgarteForces);

}

}